

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3PagerSetFlags(Pager *pPager,uint pgFlags)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  
  if (pPager->tempFile == '\0') {
    uVar4 = pgFlags & 7;
    bVar6 = uVar4 == 1;
    bVar5 = 2 < uVar4;
    bVar7 = uVar4 == 4;
  }
  else {
    bVar6 = true;
    bVar5 = false;
    bVar7 = false;
  }
  pPager->noSync = bVar6;
  pPager->fullSync = bVar5;
  pPager->extraSync = bVar7;
  if (bVar6 == false) {
    if ((pgFlags & 8) == 0) {
      pPager->syncFlags = '\x02';
      bVar3 = 2;
    }
    else {
      pPager->syncFlags = '\x03';
      bVar3 = 3;
    }
  }
  else {
    pPager->syncFlags = '\0';
    bVar3 = 0;
  }
  bVar1 = bVar3 * '\x04';
  if (bVar5 == false) {
    bVar3 = 0;
  }
  bVar2 = 0xc;
  if (bVar6 != false) {
    bVar2 = bVar1;
  }
  if ((pgFlags & 0x10) == 0) {
    bVar2 = bVar1;
  }
  pPager->walSyncFlags = bVar2 | bVar3;
  pPager->doNotSpill = pPager->doNotSpill & 0xfe | (pgFlags & 0x20) == 0;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3PagerSetFlags(
  Pager *pPager,        /* The pager to set safety level for */
  unsigned pgFlags      /* Various flags */
){
  unsigned level = pgFlags & PAGER_SYNCHRONOUS_MASK;
  if( pPager->tempFile ){
    pPager->noSync = 1;
    pPager->fullSync = 0;
    pPager->extraSync = 0;
  }else{
    pPager->noSync =  level==PAGER_SYNCHRONOUS_OFF ?1:0;
    pPager->fullSync = level>=PAGER_SYNCHRONOUS_FULL ?1:0;
    pPager->extraSync = level==PAGER_SYNCHRONOUS_EXTRA ?1:0;
  }
  if( pPager->noSync ){
    pPager->syncFlags = 0;
  }else if( pgFlags & PAGER_FULLFSYNC ){
    pPager->syncFlags = SQLITE_SYNC_FULL;
  }else{
    pPager->syncFlags = SQLITE_SYNC_NORMAL;
  }
  pPager->walSyncFlags = (pPager->syncFlags<<2);
  if( pPager->fullSync ){
    pPager->walSyncFlags |= pPager->syncFlags;
  }
  if( (pgFlags & PAGER_CKPT_FULLFSYNC) && !pPager->noSync ){
    pPager->walSyncFlags |= (SQLITE_SYNC_FULL<<2);
  }
  if( pgFlags & PAGER_CACHESPILL ){
    pPager->doNotSpill &= ~SPILLFLAG_OFF;
  }else{
    pPager->doNotSpill |= SPILLFLAG_OFF;
  }
}